

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

uint32_t __thiscall wasm::WasmBinaryWriter::getTypeIndex(WasmBinaryWriter *this,HeapType type)

{
  bool bVar1;
  ostream *poVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_28;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true> local_20;
  const_iterator it;
  WasmBinaryWriter *this_local;
  HeapType type_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>)this;
  this_local = (WasmBinaryWriter *)type.id;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
       ::find(&(this->indexedTypes).indices,(key_type *)&this_local);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
       ::end(&(this->indexedTypes).indices);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>::
             operator->((_Node_const_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>
                         *)&local_20);
    return pvVar3->second;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Missing type: ");
  poVar2 = wasm::operator<<(poVar2,(HeapType)this_local);
  std::operator<<(poVar2,'\n');
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                ,0x2d6,"uint32_t wasm::WasmBinaryWriter::getTypeIndex(HeapType) const");
}

Assistant:

uint32_t WasmBinaryWriter::getTypeIndex(HeapType type) const {
  auto it = indexedTypes.indices.find(type);
#ifndef NDEBUG
  if (it == indexedTypes.indices.end()) {
    std::cout << "Missing type: " << type << '\n';
    assert(0);
  }
#endif
  return it->second;
}